

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_align<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  byte bVar1;
  bool bVar2;
  assertion_failure *this;
  ulong uVar3;
  alignment aVar4;
  error_handler *peVar5;
  
  if (begin == end) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"");
LAB_00135022:
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  peVar5 = (error_handler *)(begin + 1);
  uVar3 = (ulong)(peVar5 != (error_handler *)end);
  while (bVar1 = begin[uVar3], bVar1 < 0x3e) {
    if (bVar1 == 0x3c) {
      aVar4 = ALIGN_LEFT;
      goto LAB_00134f9e;
    }
    if (bVar1 == 0x3d) {
      aVar4 = ALIGN_NUMERIC;
      bVar2 = true;
      goto LAB_00134fa1;
    }
LAB_00134f70:
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  }
  if (bVar1 == 0x3e) {
    aVar4 = ALIGN_RIGHT;
  }
  else {
    if (bVar1 != 0x5e) goto LAB_00134f70;
    aVar4 = ALIGN_CENTER;
  }
LAB_00134f9e:
  bVar2 = false;
LAB_00134fa1:
  if ((int)uVar3 != 0) {
    if (*begin == L'{') {
      error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
    }
    peVar5 = (error_handler *)(begin + 2);
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_align_spec).fill_ = (int)*begin;
    begin = (char *)peVar5;
  }
  if (bVar2) {
    if (handler->arg_type_ == named_arg_type) {
      this = (assertion_failure *)__cxa_allocate_exception(0x10);
      assertion_failure::assertion_failure(this,"invalid argument type");
      goto LAB_00135022;
    }
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error((error_handler *)begin,"format specifier requires numeric argument");
    }
  }
  (((handler->
    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ).super_specs_setter<char>.specs_)->super_align_spec).align_ = aVar4;
  return (char *)peVar5;
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}